

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::TraverseSchema::traverseRedefine(TraverseSchema *this,DOMElement *redefineElem)

{
  SchemaInfo *pSVar1;
  SchemaInfo *pSVar2;
  DOMElement *root;
  SchemaInfo *redefinedInfo;
  SchemaInfo *saveInfo;
  NamespaceScopeManager nsMgr;
  DOMElement *redefineElem_local;
  TraverseSchema *this_local;
  
  nsMgr.fSchemaInfo = (SchemaInfo *)redefineElem;
  NamespaceScopeManager::NamespaceScopeManager
            ((NamespaceScopeManager *)&saveInfo,redefineElem,this->fSchemaInfo,this);
  pSVar1 = this->fSchemaInfo;
  pSVar2 = RefHashTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::PtrHasher>::get
                     (this->fPreprocessedNodes,nsMgr.fSchemaInfo);
  if (pSVar2 != (SchemaInfo *)0x0) {
    this->fSchemaInfo = pSVar2;
    root = SchemaInfo::getRoot(this->fSchemaInfo);
    processChildren(this,root);
    this->fSchemaInfo = pSVar1;
    processChildren(this,(DOMElement *)nsMgr.fSchemaInfo);
  }
  NamespaceScopeManager::~NamespaceScopeManager((NamespaceScopeManager *)&saveInfo);
  return;
}

Assistant:

void TraverseSchema::traverseRedefine(const DOMElement* const redefineElem) {

    NamespaceScopeManager nsMgr(redefineElem, fSchemaInfo, this);

    SchemaInfo* saveInfo = fSchemaInfo;
    SchemaInfo* redefinedInfo = fPreprocessedNodes->get(redefineElem);

    if (redefinedInfo) {

        // Now we have to march through our nicely-renamed schemas. When
        // we do these traversals other <redefine>'s may perhaps be
        // encountered; we leave recursion to sort this out.
        fSchemaInfo = redefinedInfo;
        processChildren(fSchemaInfo->getRoot());
        fSchemaInfo = saveInfo;

        // Now traverse our own <redefine>
        processChildren(redefineElem);
    }
}